

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int get_traffic_keys(ptls_aead_algorithm_t *aead,ptls_hash_algorithm_t *hash,void *key,void *iv,
                    void *secret,ptls_iovec_t hash_value,char *label_prefix)

{
  int local_3c;
  int ret;
  char *label_prefix_local;
  void *secret_local;
  void *iv_local;
  void *key_local;
  ptls_hash_algorithm_t *hash_local;
  ptls_aead_algorithm_t *aead_local;
  
  local_3c = get_traffic_key(hash,key,aead->key_size,0,secret,hash_value,label_prefix);
  if ((local_3c == 0) &&
     (local_3c = get_traffic_key(hash,iv,aead->iv_size,1,secret,hash_value,label_prefix),
     local_3c == 0)) {
    return 0;
  }
  (*ptls_clear_memory)(key,aead->key_size);
  (*ptls_clear_memory)(iv,aead->iv_size);
  return local_3c;
}

Assistant:

static int get_traffic_keys(ptls_aead_algorithm_t *aead, ptls_hash_algorithm_t *hash, void *key, void *iv, const void *secret,
                            ptls_iovec_t hash_value, const char *label_prefix)
{
    int ret;

    if ((ret = get_traffic_key(hash, key, aead->key_size, 0, secret, hash_value, label_prefix)) != 0 ||
        (ret = get_traffic_key(hash, iv, aead->iv_size, 1, secret, hash_value, label_prefix)) != 0) {
        ptls_clear_memory(key, aead->key_size);
        ptls_clear_memory(iv, aead->iv_size);
    }

    return ret;
}